

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator.cpp
# Opt level: O0

void helics::addOperations(Translator *trans,TranslatorTypes type)

{
  int in_ESI;
  shared_ptr<helics::TranslatorOperations> *in_RDI;
  shared_ptr<helics::BinaryTranslatorOperation> operation_1;
  shared_ptr<helics::JsonTranslatorOperation> operation;
  shared_ptr<helics::JsonTranslatorOperation> *in_stack_ffffffffffffff68;
  shared_ptr<helics::BinaryTranslatorOperation> *__r;
  shared_ptr<helics::TranslatorOperations> *in_stack_ffffffffffffff70;
  shared_ptr<helics::TranslatorOperations> *in_stack_ffffffffffffffa8;
  Translator *in_stack_ffffffffffffffb0;
  
  if (in_ESI != 0) {
    if (in_ESI == 0xb) {
      std::make_shared<helics::JsonTranslatorOperation>();
      std::shared_ptr<helics::TranslatorOperations>::
      shared_ptr<helics::JsonTranslatorOperation,void>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      Translator::setTranslatorOperations(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::shared_ptr<helics::TranslatorOperations>::~shared_ptr
                ((shared_ptr<helics::TranslatorOperations> *)0x3201b3);
      std::shared_ptr<helics::JsonTranslatorOperation>::~shared_ptr
                ((shared_ptr<helics::JsonTranslatorOperation> *)0x3201bd);
    }
    else if (in_ESI == 0xc) {
      __r = (shared_ptr<helics::BinaryTranslatorOperation> *)&stack0xffffffffffffffb0;
      std::make_shared<helics::BinaryTranslatorOperation>();
      std::shared_ptr<helics::TranslatorOperations>::
      shared_ptr<helics::BinaryTranslatorOperation,void>(in_RDI,__r);
      Translator::setTranslatorOperations(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::shared_ptr<helics::TranslatorOperations>::~shared_ptr
                ((shared_ptr<helics::TranslatorOperations> *)0x320232);
      std::shared_ptr<helics::BinaryTranslatorOperation>::~shared_ptr
                ((shared_ptr<helics::BinaryTranslatorOperation> *)0x32023c);
    }
  }
  return;
}

Assistant:

void addOperations(Translator* trans, TranslatorTypes type)
{
    switch (type) {
        case TranslatorTypes::CUSTOM:
        default:
            break;
        case TranslatorTypes::JSON: {
            auto operation = std::make_shared<JsonTranslatorOperation>();
            trans->setTranslatorOperations(std::move(operation));
        } break;
        case TranslatorTypes::BINARY: {
            auto operation = std::make_shared<BinaryTranslatorOperation>();
            trans->setTranslatorOperations(std::move(operation));
        } break;
    }
}